

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_func_queue_examples.cpp
# Opt level: O0

void density_tests::
     SpFunctionQueueSamples<(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1>
     ::func_queue_reentrant_misc_samples(ostream *param_1)

{
  bool bVar1;
  bool bVar2;
  int *piVar3;
  sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  queue_5;
  type result_2;
  sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  queue_1_2;
  sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  queue_4;
  type result_1;
  sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  queue_1_1;
  sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  queue_3;
  type result;
  type queue_1;
  sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  queue_2;
  sp_function_queue<int_(float,_double),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  queue;
  anon_class_1_0_00000001 local_581;
  sp_function_queue<int(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
  local_580 [24];
  sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  *in_stack_fffffffffffffa98;
  sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  *in_stack_fffffffffffffaa0;
  undefined1 local_4cc [12];
  sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_4c0;
  sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_440;
  undefined1 local_38c [12];
  sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_380;
  sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_300;
  undefined1 local_248 [199];
  anon_class_1_0_00000001 local_181;
  sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_180;
  sp_function_queue<int_(float,_double),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_100;
  
  density::
  sp_function_queue<int_(float,_double),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_function_queue(&local_100);
  bVar1 = density::
          sp_function_queue<int_(float,_double),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::empty(&local_100);
  if (!bVar1) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_func_queue_examples.cpp"
                  ,0x335,
                  "static void density_tests::SpFunctionQueueSamples<density::function_standard_erasure, density::concurrency_single, density::concurrency_multiple>::func_queue_reentrant_misc_samples(std::ostream &) [ERASURE = density::function_standard_erasure, PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_function_queue<int_(float,_double),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_function_queue(&local_100);
  density::
  sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_function_queue(&local_180);
  density::
  sp_function_queue<int(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::
  push<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1>::func_queue_reentrant_misc_samples(std::ostream&)::_lambda()_1_>
            ((sp_function_queue<int(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)&local_180,&local_181);
  density::
  sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_function_queue((sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                       *)(local_248 + 8),&local_180);
  bVar1 = density::
          sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::empty(&local_180);
  if (!bVar1) {
    __assert_fail("queue.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_func_queue_examples.cpp"
                  ,0x345,
                  "static void density_tests::SpFunctionQueueSamples<density::function_standard_erasure, density::concurrency_single, density::concurrency_multiple>::func_queue_reentrant_misc_samples(std::ostream &) [ERASURE = density::function_standard_erasure, PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::try_consume((sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                 *)local_248);
  bVar2 = density::builtin_optional::operator_cast_to_bool((builtin_optional *)local_248);
  bVar1 = false;
  if (bVar2) {
    piVar3 = density::builtin_optional<int>::operator*((builtin_optional<int> *)local_248);
    bVar1 = *piVar3 == 6;
  }
  if (!bVar1) {
    __assert_fail("result && *result == 6",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_func_queue_examples.cpp"
                  ,0x348,
                  "static void density_tests::SpFunctionQueueSamples<density::function_standard_erasure, density::concurrency_single, density::concurrency_multiple>::func_queue_reentrant_misc_samples(std::ostream &) [ERASURE = density::function_standard_erasure, PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::builtin_optional<int>::~builtin_optional((builtin_optional<int> *)local_248);
  density::
  sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_function_queue
            ((sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
              *)(local_248 + 8));
  density::
  sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_function_queue(&local_180);
  density::
  sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_function_queue(&local_300);
  density::
  sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_function_queue(&local_380);
  density::
  sp_function_queue<int(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::
  push<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1>::func_queue_reentrant_misc_samples(std::ostream&)::_lambda()_2_>
            ((sp_function_queue<int(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)&local_300,(anon_class_1_0_00000001 *)(local_38c + 0xb));
  density::
  sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::operator=(&local_380,&local_300);
  density::
  sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::try_consume((sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                 *)local_38c);
  bVar2 = density::builtin_optional::operator_cast_to_bool((builtin_optional *)local_38c);
  bVar1 = false;
  if (bVar2) {
    piVar3 = density::builtin_optional<int>::operator*((builtin_optional<int> *)local_38c);
    bVar1 = *piVar3 == 6;
  }
  if (bVar1) {
    density::builtin_optional<int>::~builtin_optional((builtin_optional<int> *)local_38c);
    density::
    sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::~sp_function_queue(&local_380);
    density::
    sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::~sp_function_queue(&local_300);
    density::
    sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::sp_function_queue(&local_440);
    density::
    sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::sp_function_queue(&local_4c0);
    density::
    sp_function_queue<int(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
    ::
    push<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1>::func_queue_reentrant_misc_samples(std::ostream&)::_lambda()_3_>
              ((sp_function_queue<int(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
                *)&local_440,(anon_class_1_0_00000001 *)(local_4cc + 0xb));
    std::
    swap<density::sp_function_queue<int(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>>
              (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
    bVar1 = density::
            sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
            ::empty(&local_440);
    if (!bVar1) {
      __assert_fail("queue.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_func_queue_examples.cpp"
                    ,0x36a,
                    "static void density_tests::SpFunctionQueueSamples<density::function_standard_erasure, density::concurrency_single, density::concurrency_multiple>::func_queue_reentrant_misc_samples(std::ostream &) [ERASURE = density::function_standard_erasure, PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                   );
    }
    density::
    sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::try_consume((sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                   *)local_4cc);
    bVar2 = density::builtin_optional::operator_cast_to_bool((builtin_optional *)local_4cc);
    bVar1 = false;
    if (bVar2) {
      piVar3 = density::builtin_optional<int>::operator*((builtin_optional<int> *)local_4cc);
      bVar1 = *piVar3 == 6;
    }
    if (bVar1) {
      density::builtin_optional<int>::~builtin_optional((builtin_optional<int> *)local_4cc);
      density::
      sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
      ::~sp_function_queue(&local_4c0);
      density::
      sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
      ::~sp_function_queue(&local_440);
      density::
      sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
      ::sp_function_queue((sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                           *)local_580);
      density::
      sp_function_queue<int(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
      ::
      push<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1>::func_queue_reentrant_misc_samples(std::ostream&)::_lambda()_4_>
                (local_580,&local_581);
      density::
      sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
      ::clear<(density::function_type_erasure)0,_nullptr>
                ((sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                  *)local_580);
      bVar1 = density::
              sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
              ::empty((sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                       *)local_580);
      if (bVar1) {
        density::
        sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
        ::~sp_function_queue
                  ((sp_function_queue<int_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                    *)local_580);
        return;
      }
      __assert_fail("queue.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_func_queue_examples.cpp"
                    ,0x37c,
                    "static void density_tests::SpFunctionQueueSamples<density::function_standard_erasure, density::concurrency_single, density::concurrency_multiple>::func_queue_reentrant_misc_samples(std::ostream &) [ERASURE = density::function_standard_erasure, PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                   );
    }
    __assert_fail("result && *result == 6",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_func_queue_examples.cpp"
                  ,0x36d,
                  "static void density_tests::SpFunctionQueueSamples<density::function_standard_erasure, density::concurrency_single, density::concurrency_multiple>::func_queue_reentrant_misc_samples(std::ostream &) [ERASURE = density::function_standard_erasure, PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  __assert_fail("result && *result == 6",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_func_queue_examples.cpp"
                ,0x35a,
                "static void density_tests::SpFunctionQueueSamples<density::function_standard_erasure, density::concurrency_single, density::concurrency_multiple>::func_queue_reentrant_misc_samples(std::ostream &) [ERASURE = density::function_standard_erasure, PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
               );
}

Assistant:

static void func_queue_reentrant_misc_samples(std::ostream &)
        {
            using namespace density;

            {
                //! [sp_function_queue default construct example 1]
                sp_function_queue<
                  int(float, double),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>
                  queue;
                assert(queue.empty());
                //! [sp_function_queue default construct example 1]
            }

            {
                //! [sp_function_queue move construct example 1]
                sp_function_queue<
                  int(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>
                  queue;
                queue.push([] { return 6; });

                auto queue_1(std::move(queue));
                assert(queue.empty());

                auto result = queue_1.try_consume();
                assert(result && *result == 6);
                //! [sp_function_queue move construct example 1]
            }

            {
                //! [sp_function_queue move assign example 1]
                sp_function_queue<
                  int(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>
                  queue, queue_1;
                queue.push([] { return 6; });

                queue_1 = std::move(queue);

                auto result = queue_1.try_consume();
                assert(result && *result == 6);
                //! [sp_function_queue move assign example 1]
            }

            {
                //! [sp_function_queue swap example 1]
                sp_function_queue<
                  int(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>
                  queue, queue_1;
                queue.push([] { return 6; });

                std::swap(queue, queue_1);
                assert(queue.empty());

                auto result = queue_1.try_consume();
                assert(result && *result == 6);
                //! [sp_function_queue swap example 1]
            }

            {
                //! [sp_function_queue clear example 1]
                sp_function_queue<
                  int(),
                  default_allocator,
                  function_standard_erasure,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>
                  queue;
                queue.push([] { return 6; });
                queue.clear();
                assert(queue.empty());
                //! [sp_function_queue clear example 1]
            }
        }